

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav_uint64 drwav_read_f32__ieee(drwav *pWav,drwav_uint64 samplesToRead,float *pBufferOut)

{
  size_t i;
  drwav_uint64 dVar1;
  drwav_uint64 dVar2;
  ulong uVar3;
  drwav_uint64 dVar4;
  uchar sampleData [4096];
  double local_1038 [513];
  
  if ((pWav->translatedFormatTag == 3) && (pWav->bytesPerSample == 4)) {
    dVar1 = drwav_read(pWav,samplesToRead,pBufferOut);
    return dVar1;
  }
  if (pWav->bytesPerSample == 0) {
    dVar1 = 0;
  }
  else {
    dVar1 = 0;
    do {
      if (samplesToRead == 0) {
        return dVar1;
      }
      uVar3 = (ulong)(0x1000 / pWav->bytesPerSample);
      if (samplesToRead < uVar3) {
        uVar3 = samplesToRead;
      }
      dVar2 = drwav_read(pWav,uVar3,local_1038);
      if (dVar2 != 0) {
        if (pWav->bytesPerSample == 8) {
          if (pBufferOut != (float *)0x0) {
            dVar4 = 0;
            do {
              pBufferOut[dVar4] = (float)local_1038[dVar4];
              dVar4 = dVar4 + 1;
            } while (dVar2 != dVar4);
          }
        }
        else if (pWav->bytesPerSample == 4) {
          uVar3 = 0;
          do {
            pBufferOut[uVar3] = *(float *)((long)local_1038 + uVar3 * 4);
            uVar3 = uVar3 + 1;
          } while ((uVar3 & 0xffffffff) < dVar2);
        }
        else {
          memset(pBufferOut,0,dVar2 * 4);
        }
        pBufferOut = pBufferOut + dVar2;
        samplesToRead = samplesToRead - dVar2;
        dVar1 = dVar1 + dVar2;
      }
    } while (dVar2 != 0);
  }
  return dVar1;
}

Assistant:

drwav_uint64 drwav_read_f32__ieee(drwav* pWav, drwav_uint64 samplesToRead, float* pBufferOut) {
    // Fast path.
    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_IEEE_FLOAT && pWav->bytesPerSample == 4) {
        return drwav_read(pWav, samplesToRead, pBufferOut);
    }

    if (pWav->bytesPerSample == 0) {
        return 0;
    }

    drwav_uint64 totalSamplesRead = 0;
    unsigned char sampleData[4096];
    while (samplesToRead > 0) {
        drwav_uint64 samplesRead =
            drwav_read(pWav, drwav_min(samplesToRead, sizeof(sampleData) / pWav->bytesPerSample), sampleData);
        if (samplesRead == 0) {
            break;
        }

        drwav__ieee_to_f32(pBufferOut, sampleData, (size_t)samplesRead, pWav->bytesPerSample);

        pBufferOut += samplesRead;
        samplesToRead -= samplesRead;
        totalSamplesRead += samplesRead;
    }

    return totalSamplesRead;
}